

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_item_query.c
# Opt level: O3

mpt_config_item * mpt_config_item_query(mpt_array *arr,mpt_path *path)

{
  mpt_array mVar1;
  char *pcVar2;
  size_t sVar3;
  mpt_type_traits *pmVar4;
  int nlen;
  int iVar5;
  mpt_type_traits *pmVar6;
  ulong uVar7;
  mpt_identifier *id;
  
  while( true ) {
    mVar1._buf = arr->_buf;
    if (mVar1._buf == (mpt_buffer *)0x0) {
      return (mpt_config_item *)0x0;
    }
    pcVar2 = path->base;
    sVar3 = path->off;
    nlen = mpt_path_next(path);
    if (nlen < 0) {
      return (mpt_config_item *)0x0;
    }
    pmVar4 = (mVar1._buf)->_content_traits;
    pmVar6 = mpt_config_item_traits();
    if (pmVar4 != pmVar6) {
      return (mpt_config_item *)0x0;
    }
    if ((mVar1._buf)->_size < 0x20) break;
    uVar7 = (mVar1._buf)->_size >> 5;
    id = (mpt_identifier *)&mVar1._buf[1]._size;
    while ((id->_len == 0 || (iVar5 = mpt_identifier_compare(id,pcVar2 + sVar3,nlen), iVar5 != 0)))
    {
      uVar7 = uVar7 - 1;
      id = id + 2;
      if (uVar7 == 0) {
        return (mpt_config_item *)0x0;
      }
    }
    arr = (mpt_array *)(id + -1);
    if (path->len == 0) {
      return (mpt_config_item *)(id + -1);
    }
  }
  return (mpt_config_item *)0x0;
}

Assistant:

extern MPT_STRUCT(config_item) *mpt_config_item_query(const _MPT_UARRAY_TYPE(MPT_STRUCT(config_item)) *arr, MPT_STRUCT(path) *path)
{
	const MPT_STRUCT(buffer) *buf;
	MPT_STRUCT(config_item) *item;
	const char *name;
	size_t item_count;
	int len;
	
	name = path->base + path->off;
	if (!(buf = arr->_buf) || (len = mpt_path_next(path)) < 0) {
		return 0;
	}
	if (buf->_content_traits != mpt_config_item_traits()) {
		return 0;
	}
	item_count = buf->_size / sizeof(*item);
	item = (MPT_STRUCT(config_item) *) (buf + 1);
	while (item_count--) {
		if (item->identifier._len == 0
		 || mpt_identifier_compare(&item->identifier, name, len) != 0) {
			++item;
			continue;
		}
		if (path->len) {
			return mpt_config_item_query(&item->elements, path);
		}
		return item;
	}
	return 0;
}